

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

void read_callback(void *context,cio_epoll_error error)

{
  long lVar1;
  cio_error cVar2;
  ssize_t sVar3;
  int *piVar4;
  code *UNRECOVERED_JUMPTABLE;
  int iVar5;
  undefined8 uVar6;
  
  lVar1 = *(long *)((long)context + 0x28);
  cVar2 = cio_linux_eventloop_unregister_read
                    (*(cio_eventloop **)((long)context + 200),
                     (cio_event_notifier *)((long)context + 0x68));
  if (cVar2 != CIO_SUCCESS) {
    (**(code **)((long)context + 0x18))
              (context,*(undefined8 *)((long)context + 0x20),cVar2,lVar1,
               *(code **)((long)context + 0x18));
    return;
  }
  if (error != CIO_EPOLL_SUCCESS) {
    read_callback_cold_1();
    return;
  }
  sVar3 = read(*(int *)((long)context + 0x80),*(void **)(lVar1 + 0x10),
               *(long *)(lVar1 + 8) - (long)*(void **)(lVar1 + 0x10));
  if (sVar3 == 0) {
    *(undefined1 *)((long)context + 0xd0) = 1;
    iVar5 = 1;
  }
  else {
    if (sVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 == 0xb) {
        return;
      }
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x18);
      uVar6 = *(undefined8 *)((long)context + 0x20);
      iVar5 = -*piVar4;
      goto LAB_00102ba4;
    }
    *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + sVar3;
    iVar5 = 0;
  }
  UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x18);
  uVar6 = *(undefined8 *)((long)context + 0x20);
LAB_00102ba4:
  (*UNRECOVERED_JUMPTABLE)(context,uVar6,iVar5,lVar1);
  return;
}

Assistant:

static void read_callback(void *context, enum cio_epoll_error error)
{
	struct cio_io_stream *stream = context;
	struct cio_read_buffer *read_buffer = stream->read_buffer;
	struct cio_socket *socket = cio_container_of(stream, struct cio_socket, stream);

	enum cio_error err = cio_linux_eventloop_unregister_read(socket->impl.loop, &socket->impl.ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
		return;
	}

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		err = cio_linux_get_socket_error(socket->impl.ev.fd);
		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
		return;
	}

	ssize_t ret = read(socket->impl.ev.fd, read_buffer->add_ptr, cio_read_buffer_space_available(read_buffer));
	if (ret == -1) {
		if (cio_unlikely(errno != EAGAIN)) {
			stream->read_handler(stream, stream->read_handler_context, (enum cio_error)(-errno), read_buffer);
		}
	} else {
		if (ret == 0) {
			err = CIO_EOF;
			socket->impl.peer_closed_connection = true;
		} else {
			read_buffer->add_ptr += (size_t)ret;
		}

		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
	}
}